

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_sse4.c
# Opt level: O0

void blend_a64_mask_bn_sx_w8n_sse4_1
               (uint16_t *dst,uint32_t dst_stride,uint16_t *src0,uint32_t src0_stride,uint16_t *src1
               ,uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int w,int h,
               blend_unit_fn blend)

{
  uint in_ECX;
  long in_RDX;
  longlong extraout_RDX;
  uint in_ESI;
  long lVar1;
  long in_RDI;
  long in_R8;
  uint in_R9D;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qb;
  __m128i alVar6;
  long in_stack_00000008;
  __m128i v_res_w;
  __m128i v_m1_w;
  __m128i v_m0_w;
  __m128i v_a_b;
  __m128i v_r_b;
  int c;
  __m128i v_maxval_w;
  __m128i v_zmask_b;
  undefined4 local_10c;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined1 local_78;
  undefined1 uStack_77;
  undefined1 uStack_76;
  undefined1 uStack_75;
  undefined1 uStack_74;
  undefined1 uStack_73;
  undefined1 uStack_72;
  undefined1 uStack_71;
  undefined1 uStack_70;
  undefined1 uStack_6f;
  undefined1 uStack_6e;
  undefined1 uStack_6d;
  undefined1 uStack_6c;
  undefined1 uStack_6b;
  undefined1 uStack_6a;
  undefined1 uStack_69;
  undefined2 uStack_46;
  undefined2 uStack_44;
  undefined2 uStack_42;
  
  local_d8 = in_R8;
  local_c8 = in_RDX;
  local_b8 = in_RDI;
  do {
    for (local_10c = 0; local_10c < (int)v_res_w[1]; local_10c = local_10c + 8) {
      alVar6 = xx_loadu_128((void *)(in_stack_00000008 + local_10c * 2));
      local_78 = (undefined1)extraout_XMM0_Qa;
      uStack_77 = (undefined1)((ulong)extraout_XMM0_Qa >> 8);
      uStack_76 = (undefined1)((ulong)extraout_XMM0_Qa >> 0x10);
      uStack_75 = (undefined1)((ulong)extraout_XMM0_Qa >> 0x18);
      uStack_74 = (undefined1)((ulong)extraout_XMM0_Qa >> 0x20);
      uStack_73 = (undefined1)((ulong)extraout_XMM0_Qa >> 0x28);
      uStack_72 = (undefined1)((ulong)extraout_XMM0_Qa >> 0x30);
      uStack_71 = (undefined1)((ulong)extraout_XMM0_Qa >> 0x38);
      uStack_70 = (undefined1)extraout_XMM0_Qb;
      uStack_6f = (undefined1)((ulong)extraout_XMM0_Qb >> 8);
      uStack_6e = (undefined1)((ulong)extraout_XMM0_Qb >> 0x10);
      uStack_6d = (undefined1)((ulong)extraout_XMM0_Qb >> 0x18);
      uStack_6c = (undefined1)((ulong)extraout_XMM0_Qb >> 0x20);
      uStack_6b = (undefined1)((ulong)extraout_XMM0_Qb >> 0x28);
      uStack_6a = (undefined1)((ulong)extraout_XMM0_Qb >> 0x30);
      uStack_69 = (undefined1)((ulong)extraout_XMM0_Qb >> 0x38);
      bVar2 = pavgb(local_78,uStack_77);
      pavgb(uStack_77,uStack_76);
      bVar3 = pavgb(uStack_76,uStack_75);
      pavgb(uStack_75,uStack_74);
      bVar4 = pavgb(uStack_74,uStack_73);
      pavgb(uStack_73,uStack_72);
      bVar5 = pavgb(uStack_72,uStack_71);
      pavgb(uStack_71,uStack_70);
      pavgb(uStack_70,uStack_6f);
      pavgb(uStack_6f,uStack_6e);
      pavgb(uStack_6e,uStack_6d);
      pavgb(uStack_6d,uStack_6c);
      pavgb(uStack_6c,uStack_6b);
      pavgb(uStack_6b,uStack_6a);
      pavgb(uStack_6a,uStack_69);
      pavgb(uStack_69,0);
      uStack_46 = (ushort)bVar3;
      uStack_44 = (ushort)bVar4;
      uStack_42 = (ushort)bVar5;
      lVar1 = local_d8 + (long)local_10c * 2;
      (*(code *)v_m1_w[1])
                ((ulong)CONCAT16(bVar5,(uint6)CONCAT14(bVar4,(uint)CONCAT12(bVar3,(ushort)bVar2))),
                 CONCAT26(0x40 - uStack_42,
                          CONCAT24(0x40 - uStack_44,CONCAT22(0x40 - uStack_46,0x40 - (ushort)bVar2))
                         ),local_c8 + (long)local_10c * 2,lVar1,alVar6[1]);
      alVar6[1] = extraout_RDX;
      alVar6[0] = lVar1;
      xx_storeu_128((void *)(local_b8 + (long)local_10c * 2),alVar6);
    }
    local_b8 = local_b8 + (ulong)in_ESI * 2;
    local_c8 = local_c8 + (ulong)in_ECX * 2;
    local_d8 = local_d8 + (ulong)in_R9D * 2;
    in_stack_00000008 = in_stack_00000008 + (ulong)(uint)v_res_w[0];
    v_m1_w[0]._0_4_ = (int)v_m1_w[0] + -1;
  } while ((int)v_m1_w[0] != 0);
  return;
}

Assistant:

static inline void blend_a64_mask_bn_sx_w8n_sse4_1(
    uint16_t *dst, uint32_t dst_stride, const uint16_t *src0,
    uint32_t src0_stride, const uint16_t *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int w, int h,
    blend_unit_fn blend) {
  const __m128i v_zmask_b =
      _mm_set_epi8(0, -1, 0, -1, 0, -1, 0, -1, 0, -1, 0, -1, 0, -1, 0, -1);
  const __m128i v_maxval_w = _mm_set1_epi16(AOM_BLEND_A64_MAX_ALPHA);

  do {
    int c;
    for (c = 0; c < w; c += 8) {
      const __m128i v_r_b = xx_loadu_128(mask + 2 * c);
      const __m128i v_a_b = _mm_avg_epu8(v_r_b, _mm_srli_si128(v_r_b, 1));

      const __m128i v_m0_w = _mm_and_si128(v_a_b, v_zmask_b);
      const __m128i v_m1_w = _mm_sub_epi16(v_maxval_w, v_m0_w);

      const __m128i v_res_w = blend(src0 + c, src1 + c, v_m0_w, v_m1_w);

      xx_storeu_128(dst + c, v_res_w);
    }
    dst += dst_stride;
    src0 += src0_stride;
    src1 += src1_stride;
    mask += mask_stride;
  } while (--h);
}